

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameinput.cpp
# Opt level: O0

void __thiscall gamespace::GameScreenInputState::mouse(GameScreenInputState *this,double x,double y)

{
  Point *pPVar1;
  void **ppvVar2;
  Camera *this_00;
  Context *pCVar3;
  Point PVar4;
  double deltaT;
  double y_local;
  double x_local;
  GameScreenInputState *this_local;
  
  this->_last_x = x;
  this->_last_y = y;
  if (this->_mouse_mode == UIINTERACTION) {
    if (this->_selected_menu == (Renderable *)0x0) {
      __assert_fail("_selected_menu",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/game/screens/gameinput.cpp"
                    ,0x41,"void gamespace::GameScreenInputState::mouse(double, double)");
    }
    PVar4.y = (float)(this->_resy - y);
    PVar4.x = (float)x;
    PVar4 = ui::operator+(this->_origin_save,PVar4);
    PVar4 = ui::operator-(PVar4,this->_mouse_save);
    pPVar1 = ui::Area::origin(&this->_selected_menu->super_Area);
    *pPVar1 = PVar4;
    ppvVar2 = ui::Renderable::payload(this->_selected_menu);
    (**(code **)(**ppvVar2 + 0x10))();
  }
  else {
    this_00 = GameScreenImpl::camera(this->_impl);
    pCVar3 = GameScreenImpl::context(this->_impl);
    deltaT = qe::Context::deltaT(pCVar3);
    qe::Camera::mouseMoved(this_00,deltaT,x,y,this->_mouse_mode == LOCKED);
    if (this->_mouse_mode == LOCKED) {
      pCVar3 = GameScreenImpl::context(this->_impl);
      qe::Context::resetMouse(pCVar3);
    }
  }
  return;
}

Assistant:

void GameScreenInputState::mouse(double x, double y) {
    _last_x = x;
    _last_y = y;
    if(_mouse_mode == UIINTERACTION) {
        assert(_selected_menu);
        _selected_menu->origin() = _origin_save + ui::Point {(float)x, (float)(_resy - y)} - _mouse_save;
        ((CoordinateMenu*)_selected_menu->payload())->invalidate();
    } else {
        _impl->camera()->mouseMoved(_impl->context()->deltaT(), x, y, _mouse_mode == LOCKED);
        if(_mouse_mode == LOCKED) {
            _impl->context()->resetMouse();
        }
    }
}